

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.hpp
# Opt level: O0

void __thiscall Utils::ArgObject::ArgObject(ArgObject *this,string *_n,string *_d)

{
  string *_d_local;
  string *_n_local;
  ArgObject *this_local;
  
  this->_vptr_ArgObject = (_func_int **)&PTR__ArgObject_0015eb68;
  std::__cxx11::string::string((string *)&this->name,(string *)_n);
  std::__cxx11::string::string((string *)&this->description,(string *)_d);
  this->parsed = false;
  return;
}

Assistant:

ArgObject(const std::string& _n, const std::string& _d) :
        name(_n), description(_d), parsed(false) {}